

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

void __thiscall despot::BaseTag::CreateBeliefUpperBound(BaseTag *this)

{
  string *in_RSI;
  
  CreateBeliefUpperBound
            ((BaseTag *)
             &this[-1].memory_pool_.freelist_.
              super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
              super__Vector_impl_data._M_finish,in_RSI);
  return;
}

Assistant:

BeliefUpperBound* BaseTag::CreateBeliefUpperBound(string name) const {
	if (name == "TRIVIAL") {
		return new TrivialBeliefUpperBound(this);
	} else if (name == "DEFAULT" || name == "MDP") {
		return new MDPUpperBound(this, *this);
	} else if (name == "MANHATTAN") {
		return new TagManhattanUpperBound(this);
	} else {
		if (name != "print")
			cerr << "Unsupported belief upper bound: " << name << endl;
		cerr << "Supported types: TRIVIAL, MDP, MANHATTAN (default to MDP)" << endl;
		exit(1);
		return NULL;
	}
}